

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-filenames.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_8282a::assert_string_view_eq
          (anon_unknown_dwarf_8282a *this,char *s,string_view sv)

{
  bool bVar1;
  char *pcVar2;
  anon_unknown_dwarf_8282a *lhs;
  const_reference rhs;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  size_t i;
  AssertHelper local_50;
  Message local_48;
  size_type local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  size_t len;
  char *s_local;
  string_view sv_local;
  
  sv_local.data_ = sv.data_;
  s_local = s;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)strlen((char *)this);
  local_40 = wabt::string_view::size((string_view *)&s_local);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_38,"len","sv.size()",(unsigned_long *)&gtest_ar.message_,
             &local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-filenames.cc"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (bVar1) {
    for (gtest_ar_1.message_.ptr_ =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar_1.message_.ptr_ < gtest_ar.message_.ptr_;
        gtest_ar_1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(gtest_ar_1.message_.ptr_)->field_0x1) {
      lhs = this + (long)gtest_ar_1.message_.ptr_;
      rhs = wabt::string_view::operator[]
                      ((string_view *)&s_local,(size_type)gtest_ar_1.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<char,char>
                ((EqHelper<false> *)local_70,"s[i]","sv[i]",(char *)lhs,rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
      if (!bVar1) {
        testing::Message::Message(&local_78);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-filenames.cc"
                   ,0x1d,pcVar2);
        testing::internal::AssertHelper::operator=(&local_80,&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        testing::Message::~Message(&local_78);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
      if (!bVar1) {
        return;
      }
    }
  }
  return;
}

Assistant:

void assert_string_view_eq(const char* s, string_view sv) {
  size_t len = std::strlen(s);
  ASSERT_EQ(len, sv.size());
  for (size_t i = 0; i < len; ++i) {
    ASSERT_EQ(s[i], sv[i]);
  }
}